

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.cpp
# Opt level: O1

bool __thiscall Kernel::TopLevelVarLikeTermIterator::hasNext(TopLevelVarLikeTermIterator *this)

{
  Term ***pppTVar1;
  Term **ppTVar2;
  Term *term;
  TermList TVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  TermList tl;
  TermList head;
  TermList local_40;
  TermList local_38;
  
  if (hasNext()::args == '\0') {
    hasNext();
  }
  local_38._content = 2;
  bVar5 = true;
  if (this->_next == (Term *)0x0) {
    do {
      ppTVar2 = (this->_stack)._cursor;
      bVar6 = ppTVar2 == (this->_stack)._stack;
      bVar5 = !bVar6;
      if (bVar6) {
        return bVar5;
      }
      (this->_stack)._cursor = ppTVar2 + -1;
      term = ppTVar2[-1];
      ApplicativeHelper::getHeadAndArgs(term,&local_38,&hasNext::args);
      if ((((local_38._content & 1) != 0) && (hasNext::args._cursor != hasNext::args._stack)) ||
         ((bVar6 = ApplicativeHelper::isComb(local_38), bVar6 &&
          ((bVar6 = ApplicativeHelper::isUnderApplied
                              (local_38,(uint)((ulong)((long)hasNext::args._cursor -
                                                      (long)hasNext::args._stack) >> 3)), !bVar6 &&
           (uVar4 = Term::numVarOccs(term), uVar4 != 0)))))) {
        this->_next = term;
      }
      else {
        while (hasNext::args._cursor != hasNext::args._stack) {
          local_40._content = hasNext::args._cursor[-1]._content;
          hasNext::args._cursor = hasNext::args._cursor + -1;
          bVar6 = TermList::isApplication(&local_40);
          if ((bVar6) &&
             (uVar4 = Term::numVarOccs((Term *)local_40._content),
             TVar3._content = local_40._content, uVar4 != 0)) {
            if ((this->_stack)._cursor == (this->_stack)._end) {
              ::Lib::Stack<Kernel::Term_*>::expand(&this->_stack);
            }
            *(this->_stack)._cursor = (Term *)TVar3._content;
            pppTVar1 = &(this->_stack)._cursor;
            *pppTVar1 = *pppTVar1 + 1;
          }
        }
      }
    } while (this->_next == (Term *)0x0);
  }
  return bVar5;
}

Assistant:

bool TopLevelVarLikeTermIterator::hasNext()
{
  static TermStack args;
  TermList head;
  
  if(_next){ return true; }
  while(!_stack.isEmpty()){
    Term* t = _stack.pop();
    ASS(t->isApplication());
    AH::getHeadAndArgs(t, head, args);
    ASS(args.size());
    if(head.isVar() && args.size()){
      _next = t;
    } else if(AH::isComb(head) && !AH::isUnderApplied(head, args.size()) && !t->ground()){
      _next = t;
    } else {
      while(!args.isEmpty()){
        TermList tl = args.pop();
        if(tl.isApplication() && !tl.term()->ground()){
          _stack.push(tl.term());
        }
      }
    }
    if(_next) { return true; }
  }
  return false;  
}